

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O2

jpeg_scan_info * fill_dc_scans(jpeg_scan_info *scanptr,int ncomps,int Ah,int Al)

{
  ulong uVar1;
  jpeg_scan_info *pjVar2;
  ulong uVar3;
  
  if (ncomps < 5) {
    scanptr->comps_in_scan = ncomps;
    uVar1 = 0;
    uVar3 = (ulong)(uint)ncomps;
    if (ncomps < 1) {
      uVar3 = uVar1;
    }
    for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      scanptr->component_index[uVar1] = (int)uVar1;
    }
    scanptr->Ss = 0;
    scanptr->Se = 0;
    scanptr->Ah = Ah;
    scanptr->Al = Al;
    return scanptr + 1;
  }
  pjVar2 = fill_scans(scanptr,ncomps,0,0,Ah,Al);
  return pjVar2;
}

Assistant:

LOCAL(jpeg_scan_info *)
fill_dc_scans(jpeg_scan_info *scanptr, int ncomps, int Ah, int Al)
/* Support routine: generate interleaved DC scan if possible, else N scans */
{
  int ci;

  if (ncomps <= MAX_COMPS_IN_SCAN) {
    /* Single interleaved DC scan */
    scanptr->comps_in_scan = ncomps;
    for (ci = 0; ci < ncomps; ci++)
      scanptr->component_index[ci] = ci;
    scanptr->Ss = scanptr->Se = 0;
    scanptr->Ah = Ah;
    scanptr->Al = Al;
    scanptr++;
  } else {
    /* Noninterleaved DC scan for each component */
    scanptr = fill_scans(scanptr, ncomps, 0, 0, Ah, Al);
  }
  return scanptr;
}